

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_draw.cpp
# Opt level: O1

Am_Style compute_text_style(bool active,bool depressed,Computed_Colors_Record *color_rec,
                           Am_Widget_Look look,Am_Button_Type type)

{
  bool bVar1;
  Am_Style *prev;
  undefined4 in_register_0000000c;
  Am_Style *pAVar2;
  undefined7 in_register_00000039;
  int in_R9D;
  
  bVar1 = true;
  if (((in_R9D == 3) || (in_R9D == 0)) &&
     ((((Am_MACINTOSH_LOOK.value == type & (byte)color_rec) != 0 ||
       ((Am_MOTIF_LOOK.value == type &&
        (*(char *)(*(long *)CONCAT44(in_register_0000000c,look.value) + 0x40) != '\x01')))) ||
      ((Am_WINDOWS_LOOK.value == type &&
       (((in_R9D == 3 & (byte)color_rec) == 0 &&
        (*(char *)(*(long *)CONCAT44(in_register_0000000c,look.value) + 0x40) == '\0')))))))) {
    bVar1 = false;
  }
  pAVar2 = &Am_White;
  if (bVar1) {
    pAVar2 = &Am_Black;
  }
  prev = &Am_Motif_White_Inactive_Stipple;
  if (bVar1) {
    prev = &Am_Motif_Inactive_Stipple;
  }
  if (depressed) {
    prev = pAVar2;
  }
  Am_Style::Am_Style((Am_Style *)CONCAT71(in_register_00000039,active),prev);
  return (Am_Style)(Am_Style_Data *)CONCAT71(in_register_00000039,active);
}

Assistant:

Am_Style
compute_text_style(bool active, bool depressed,
                   const Computed_Colors_Record &color_rec, Am_Widget_Look look,
                   Am_Button_Type type)
{
  bool black = true;
  ;
  if ((type == Am_PUSH_BUTTON || type == Am_MENU_BUTTON) &&
      ((look == Am_MACINTOSH_LOOK && depressed) ||
       (look == Am_MOTIF_LOOK && !color_rec.data->light) ||
       (look == Am_WINDOWS_LOOK && !color_rec.data->light &&
        !(depressed && type == Am_MENU_BUTTON))))
    black = false;
  if (active) {
    if (black)
      return Am_Black;
    else
      return Am_White;
  } else {
    if (black)
      return Am_Motif_Inactive_Stipple;
    else
      return Am_Motif_White_Inactive_Stipple;
  }
}